

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

int get_blend_factor(char *value)

{
  int iVar1;
  
  iVar1 = strcmp(value,"ALLEGRO_ZERO");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(value,"ALLEGRO_ONE");
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = strcmp(value,"ALLEGRO_ALPHA");
      if (iVar1 == 0) {
        iVar1 = 2;
      }
      else {
        iVar1 = strcmp(value,"ALLEGRO_INVERSE_ALPHA");
        if (iVar1 == 0) {
          iVar1 = 3;
        }
        else {
          iVar1 = strcmp(value,"ALLEGRO_SRC_COLOR");
          if (iVar1 == 0) {
            iVar1 = 4;
          }
          else {
            iVar1 = strcmp(value,"ALLEGRO_DEST_COLOR");
            if (iVar1 == 0) {
              iVar1 = 5;
            }
            else {
              iVar1 = strcmp(value,"ALLEGRO_INVERSE_SRC_COLOR");
              if (iVar1 == 0) {
                iVar1 = 6;
              }
              else {
                iVar1 = strcmp(value,"ALLEGRO_INVERSE_DEST_COLOR");
                if (iVar1 == 0) {
                  iVar1 = 7;
                }
                else {
                  iVar1 = strcmp(value,"ALLEGRO_CONST_COLOR");
                  if (iVar1 == 0) {
                    iVar1 = 8;
                  }
                  else {
                    iVar1 = strcmp(value,"ALLEGRO_INVERSE_CONST_COLOR");
                    if (iVar1 != 0) {
                      iVar1 = atoi(value);
                      return iVar1;
                    }
                    iVar1 = 9;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int get_blend_factor(char const *value)
{
   return streq(value, "ALLEGRO_ZERO") ? ALLEGRO_ZERO
      : streq(value, "ALLEGRO_ONE") ? ALLEGRO_ONE
      : streq(value, "ALLEGRO_ALPHA") ? ALLEGRO_ALPHA
      : streq(value, "ALLEGRO_INVERSE_ALPHA") ? ALLEGRO_INVERSE_ALPHA
      : streq(value, "ALLEGRO_SRC_COLOR") ? ALLEGRO_SRC_COLOR
      : streq(value, "ALLEGRO_DEST_COLOR") ? ALLEGRO_DEST_COLOR
      : streq(value, "ALLEGRO_INVERSE_SRC_COLOR") ? ALLEGRO_INVERSE_SRC_COLOR
      : streq(value, "ALLEGRO_INVERSE_DEST_COLOR") ? ALLEGRO_INVERSE_DEST_COLOR
      : streq(value, "ALLEGRO_CONST_COLOR") ? ALLEGRO_CONST_COLOR
      : streq(value, "ALLEGRO_INVERSE_CONST_COLOR") ? ALLEGRO_INVERSE_CONST_COLOR
      : atoi(value);
}